

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

bool QUtil::is_utf16(string *val)

{
  ulong uVar1;
  char *pcVar2;
  bool local_13;
  string *val_local;
  
  uVar1 = std::__cxx11::string::length();
  if (uVar1 < 2) {
    return false;
  }
  pcVar2 = (char *)std::__cxx11::string::at((ulong)val);
  if ((*pcVar2 == -2) && (pcVar2 = (char *)std::__cxx11::string::at((ulong)val), *pcVar2 == -1)) {
    return true;
  }
  pcVar2 = (char *)std::__cxx11::string::at((ulong)val);
  local_13 = false;
  if (*pcVar2 == -1) {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)val);
    local_13 = *pcVar2 == -2;
  }
  return local_13;
}

Assistant:

bool
QUtil::is_utf16(std::string const& val)
{
    return (
        (val.length() >= 2) &&
        (((val.at(0) == '\xfe') && (val.at(1) == '\xff')) ||
         ((val.at(0) == '\xff') && (val.at(1) == '\xfe'))));
}